

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilePool.cpp
# Opt level: O2

Tile * __thiscall
TilePool::accessTile(Tile *__return_storage_ptr__,TilePool *this,size_t sectorId,uint offset)

{
  uint *in_R8;
  format_string_t<unsigned_long_&,_unsigned_int_&> fmt;
  uint offset_local;
  size_t sectorId_local;
  
  fmt.str.size_ = (size_t)&sectorId_local;
  fmt.str.data_ = (char *)0x29;
  offset_local = offset;
  sectorId_local = sectorId;
  spdlog::debug<unsigned_long&,unsigned_int&>
            ((spdlog *)"TilePool access sector {} with offset {}.",fmt,
             (unsigned_long *)&offset_local,in_R8);
  Chunk::accessTile(__return_storage_ptr__,
                    (Chunk *)(this->items_).
                             super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[sectorId_local >> 6]._M_t.
                             super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>
                    ,((uint)sectorId_local & 0x3f) * 0x10 + offset_local);
  return __return_storage_ptr__;
}

Assistant:

Tile TilePool::accessTile(size_t sectorId, unsigned int offset) {
    /*spdlog::debug("TilePool access id {}.", id);
    PoolItem* item = items_[static_cast<size_t>((id - baseId_) / CHUNK_AREA)].get();
    assert(item->allocated.test(id % CHUNK_AREA));
    return item->chunk.accessTile(id % CHUNK_AREA);*/

    spdlog::debug("TilePool access sector {} with offset {}.", sectorId, offset);
    PoolItem* item = items_[sectorId / SECTORS_PER_CHUNK].get();
    assert(item->allocated.test(sectorId % SECTORS_PER_CHUNK) && offset < SECTOR_SIZE);
    return item->chunk.accessTile(sectorId % SECTORS_PER_CHUNK * SECTOR_SIZE + offset);
}